

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetRefinedF0
               (double *x,int x_length,double fs,double current_position,double current_f0,
               double f0_floor,double f0_ceil,double *refined_f0,double *refined_score)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  double *in_RCX;
  double *in_RDX;
  double in_XMM0_Qa;
  double dVar5;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  int fft_size;
  int i;
  double *base_time;
  double window_length_in_time;
  int half_window_length;
  double *in_stack_00000080;
  int in_stack_0000008c;
  double *in_stack_00000090;
  double in_stack_00000098;
  int in_stack_000000a4;
  double in_stack_000000a8;
  double in_stack_000000b0;
  double in_stack_000000b8;
  int in_stack_000000c4;
  double *in_stack_000000c8;
  double *in_stack_000000e0;
  undefined4 local_64;
  
  if (0.0 < in_XMM2_Qa) {
    iVar2 = (int)((in_XMM0_Qa * 1.5) / in_XMM2_Qa + 1.0);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(iVar2 * 2 + 1);
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    for (local_64 = 0; local_64 < iVar2 * 2 + 1; local_64 = local_64 + 1) {
      *(double *)((long)pvVar4 + (long)local_64 * 8) = (double)(local_64 - iVar2) / in_XMM0_Qa;
    }
    dVar5 = log((double)iVar2 + (double)iVar2 + 1.0);
    pow(2.0,(double)(int)(dVar5 / 0.6931471805599453) + 2.0);
    GetMeanF0(in_stack_000000c8,in_stack_000000c4,in_stack_000000b8,in_stack_000000b0,
              in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000090,
              in_stack_0000008c,in_stack_00000080,in_stack_000000e0);
    if (((*in_RDX < in_XMM3_Qa) || (in_XMM4_Qa < *in_RDX)) || (*in_RCX <= 2.5 && *in_RCX != 2.5)) {
      *in_RDX = 0.0;
      *in_RCX = 0.0;
    }
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
  }
  else {
    *in_RDX = 0.0;
    *in_RCX = 0.0;
  }
  return;
}

Assistant:

static void GetRefinedF0(const double *x, int x_length, double fs,
    double current_position, double current_f0, double f0_floor, double f0_ceil,
    double *refined_f0, double *refined_score) {
  if (current_f0 <= 0.0) {
    *refined_f0 = 0.0;
    *refined_score = 0.0;
    return;
  }

  int half_window_length = static_cast<int>(1.5 * fs / current_f0 + 1.0);
  double window_length_in_time = (2.0 * half_window_length + 1.0) / fs;
  double *base_time = new double[half_window_length * 2 + 1];
  for (int i = 0; i < half_window_length * 2 + 1; i++)
    base_time[i] = (-half_window_length + i) / fs;
  int fft_size = static_cast<int>(pow(2.0, 2.0 +
    static_cast<int>(log(half_window_length * 2.0 + 1.0) / world::kLog2)));

  GetMeanF0(x, x_length, fs, current_position, current_f0, fft_size,
      window_length_in_time, base_time, half_window_length * 2 + 1,
      refined_f0, refined_score);

  if (*refined_f0 < f0_floor || *refined_f0 > f0_ceil ||
      *refined_score < 2.5) {
    *refined_f0 = 0.0;
    *refined_score = 0.0;
  }

  delete[] base_time;
}